

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void * __thiscall
vector<vector<vector<int>_>_>::realloc
          (vector<vector<vector<int>_>_> *this,void *__ptr,size_t __size)

{
  vector<vector<int>_> *pvVar1;
  undefined1 auVar2 [16];
  vector<vector<vector<int>_>_> *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  vector<vector<int>_> *this_00;
  vector<vector<int>_> *pvVar7;
  ulong uVar8;
  vector<vector<int>_> *local_58;
  int local_30;
  int i;
  vector<vector<int>_> *newVect;
  vector<vector<vector<int>_>_> *pvStack_10;
  int newCap_local;
  vector<vector<vector<int>_>_> *this_local;
  
  newVect._4_4_ = (uint)__ptr;
  newVect._0_4_ = 1;
  pvStack_10 = this;
  newVect._4_4_ = max<int>((int *)((long)&newVect + 4),(int *)&newVect);
  pvVar3 = (vector<vector<vector<int>_>_> *)(ulong)(uint)this->_capacity;
  if (this->_capacity != newVect._4_4_) {
    uVar4 = (ulong)(int)newVect._4_4_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar8 = uVar5 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar6 = (ulong *)operator_new__(uVar8);
    *puVar6 = uVar4;
    pvVar7 = (vector<vector<int>_> *)(puVar6 + 1);
    if (uVar4 != 0) {
      local_58 = pvVar7;
      do {
        vector<vector<int>_>::vector(local_58);
        local_58 = local_58 + 1;
      } while (local_58 != pvVar7 + uVar4);
    }
    for (local_30 = 0; local_30 < this->_size; local_30 = local_30 + 1) {
      vector<vector<int>_>::operator=(pvVar7 + local_30,this->vect + local_30);
    }
    this->_capacity = newVect._4_4_;
    pvVar1 = this->vect;
    if (pvVar1 != (vector<vector<int>_> *)0x0) {
      this_00 = pvVar1 + *(long *)&pvVar1[-1]._size;
      while (pvVar1 != this_00) {
        this_00 = this_00 + -1;
        vector<vector<int>_>::~vector(this_00);
      }
      operator_delete__(&pvVar1[-1]._size);
    }
    this->vect = pvVar7;
    pvVar3 = this;
  }
  return pvVar3;
}

Assistant:

void realloc(int newCap) {
        newCap = max(newCap, 1);
        if (_capacity == newCap) {
            return;
        }

        T *newVect = new T[newCap]();
        for (int i = 0; i < _size; ++i) {
            newVect[i] = vect[i];
        }

        _capacity = newCap;

        delete[] vect;
        vect = newVect;
    }